

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrep.c
# Opt level: O0

int xrep0_pipe_start(void *arg)

{
  long lVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  int rv;
  xrep0_sock *s;
  xrep0_pipe *p;
  void *arg_local;
  
  lVar1 = *(long *)((long)arg + 8);
  uVar2 = nni_pipe_peer(*arg);
  if (uVar2 == 0x30) {
    nni_mtx_lock((nni_mtx *)(lVar1 + 0x10));
    uVar3 = nni_pipe_id(*arg);
    arg_local._4_4_ = nni_id_set((nni_id_map *)(lVar1 + 0x40),(ulong)uVar3,arg);
    nni_mtx_unlock((nni_mtx *)(lVar1 + 0x10));
    if (arg_local._4_4_ == 0) {
      nni_msgq_aio_get(*(nni_msgq **)((long)arg + 0x10),(nni_aio *)((long)arg + 0x18));
      nni_pipe_recv(*arg,(nni_aio *)((long)arg + 0x3a8));
      arg_local._4_4_ = 0;
    }
  }
  else {
    uVar2 = nni_pipe_peer(*arg);
    nng_log_warn("NNG-PEER-MISMATCH","Peer protocol mismatch: %d != %d, rejected.",(ulong)uVar2,0x30
                );
    arg_local._4_4_ = 0xd;
  }
  return arg_local._4_4_;
}

Assistant:

static int
xrep0_pipe_start(void *arg)
{
	xrep0_pipe *p = arg;
	xrep0_sock *s = p->rep;
	int         rv;

	if (nni_pipe_peer(p->pipe) != REP0_PEER) {
		// Peer protocol mismatch.
		nng_log_warn("NNG-PEER-MISMATCH",
		    "Peer protocol mismatch: %d != %d, rejected.",
		    nni_pipe_peer(p->pipe), REP0_PEER);
		return (NNG_EPROTO);
	}

	nni_mtx_lock(&s->lk);
	rv = nni_id_set(&s->pipes, nni_pipe_id(p->pipe), p);
	nni_mtx_unlock(&s->lk);
	if (rv != 0) {
		return (rv);
	}

	nni_msgq_aio_get(p->sendq, &p->aio_getq);
	nni_pipe_recv(p->pipe, &p->aio_recv);
	return (0);
}